

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
Liby::Timestamp::toString_abi_cxx11_(string *__return_storage_ptr__,Timestamp *this)

{
  char *__s;
  long *in_FS_OFFSET;
  allocator local_81;
  tm result;
  char usecString [48];
  
  sprintf(usecString," %06ld",(this->tv_).tv_usec);
  if ((this->tv_).tv_sec == in_FS_OFFSET[-0x814]) {
    __s = (char *)(*in_FS_OFFSET + -0x4090);
  }
  else {
    localtime_r((time_t *)this,(tm *)&result);
    in_FS_OFFSET[-0x814] = (this->tv_).tv_sec;
    __s = (char *)(*in_FS_OFFSET + -0x4090);
    sprintf(__s,"%4d.%02d.%02d - %02d:%02d:%02d -",(ulong)(result.tm_year + 0x76c),
            (ulong)(result.tm_mon + 1),(ulong)(uint)result.tm_mday,(ulong)(uint)result.tm_hour,
            (ulong)(uint)result.tm_min,(ulong)(uint)result.tm_sec);
  }
  std::__cxx11::string::string((string *)&result,__s,&local_81);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 usecString);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string Timestamp::toString() const {
    char usecString[48];
#ifndef __linux__
    sprintf(usecString, " %06d", tv_.tv_usec);
#else
    sprintf(usecString, " %06ld", tv_.tv_usec);
#endif
    if (tv_.tv_sec != savedSec) {
        struct tm result;
        ::localtime_r(&(tv_.tv_sec), &result);
        savedSec = tv_.tv_sec;
        sprintf(savedSecString, "%4d.%02d.%02d - %02d:%02d:%02d -",
                result.tm_year + 1900, result.tm_mon + 1, result.tm_mday,
                result.tm_hour, result.tm_min, result.tm_sec);
    }
    return std::string(savedSecString) + usecString;
}